

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_csv.cpp
# Opt level: O3

TableFunction * duckdb::ReadCSVTableFunction::GetFunction(void)

{
  TableFunction *in_RDI;
  __alloc_node_gen_t __alloc_node_gen;
  MultiFileFunction<duckdb::CSVMultiFileInfo> read_csv;
  string local_1f8;
  _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>_>_>
  local_1d8;
  TableFunction local_1d0;
  
  local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"read_csv","");
  MultiFileFunction<duckdb::CSVMultiFileInfo>::MultiFileFunction
            ((MultiFileFunction<duckdb::CSVMultiFileInfo> *)&local_1d0,&local_1f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p);
  }
  local_1d0.serialize = CSVReaderSerialize;
  local_1d0.deserialize = CSVReaderDeserialize;
  local_1d0.type_pushdown = MultiFileFunction<duckdb::CSVMultiFileInfo>::PushdownType;
  ReadCSVAddNamedParameters(&local_1d0);
  SimpleFunction::SimpleFunction((SimpleFunction *)in_RDI,(SimpleFunction *)&local_1d0);
  (in_RDI->super_SimpleNamedParameterFunction).super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__SimpleNamedParameterFunction_0243ff38;
  local_1d8._M_h =
       (__hashtable_alloc *)&(in_RDI->super_SimpleNamedParameterFunction).named_parameters;
  (in_RDI->super_SimpleNamedParameterFunction).named_parameters._M_h._M_buckets = (__buckets_ptr)0x0
  ;
  (in_RDI->super_SimpleNamedParameterFunction).named_parameters._M_h._M_bucket_count =
       local_1d0.super_SimpleNamedParameterFunction.named_parameters._M_h._M_bucket_count;
  (in_RDI->super_SimpleNamedParameterFunction).named_parameters._M_h._M_before_begin._M_nxt =
       (_Hash_node_base *)0x0;
  (in_RDI->super_SimpleNamedParameterFunction).named_parameters._M_h._M_element_count =
       local_1d0.super_SimpleNamedParameterFunction.named_parameters._M_h._M_element_count;
  (in_RDI->super_SimpleNamedParameterFunction).named_parameters._M_h._M_rehash_policy.
  _M_max_load_factor =
       local_1d0.super_SimpleNamedParameterFunction.named_parameters._M_h._M_rehash_policy.
       _M_max_load_factor;
  *(undefined4 *)
   &(in_RDI->super_SimpleNamedParameterFunction).named_parameters._M_h._M_rehash_policy.field_0x4 =
       local_1d0.super_SimpleNamedParameterFunction.named_parameters._M_h._M_rehash_policy._4_4_;
  (in_RDI->super_SimpleNamedParameterFunction).named_parameters._M_h._M_rehash_policy._M_next_resize
       = local_1d0.super_SimpleNamedParameterFunction.named_parameters._M_h._M_rehash_policy.
         _M_next_resize;
  (in_RDI->super_SimpleNamedParameterFunction).named_parameters._M_h._M_single_bucket =
       (__node_base_ptr)0x0;
  ::std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,duckdb::LogicalType>,true>>>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)local_1d8._M_h,&local_1d0.super_SimpleNamedParameterFunction.named_parameters._M_h,
             &local_1d8);
  (in_RDI->super_SimpleNamedParameterFunction).super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__TableFunction_02435168;
  switchD_012b9b0d::default(&in_RDI->bind,&local_1d0.bind,0xd6);
  (in_RDI->function_info).internal.
  super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_1d0.function_info.internal.
       super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (in_RDI->function_info).internal.
  super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_1d0.function_info.internal.
       super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_1d0.function_info.internal.
      super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi ==
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    in_RDI->global_initialization = local_1d0.global_initialization;
    local_1d0.super_SimpleNamedParameterFunction.super_SimpleFunction.super_Function._vptr_Function
         = (_func_int **)&PTR__TableFunction_02435168;
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_1d0.function_info.internal.
       super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_1d0.function_info.internal.
            super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
      in_RDI->global_initialization = local_1d0.global_initialization;
      local_1d0.super_SimpleNamedParameterFunction.super_SimpleFunction.super_Function.
      _vptr_Function = (_func_int **)&PTR__TableFunction_02435168;
      if (local_1d0.function_info.internal.
          super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_0116eb40;
    }
    else {
      (local_1d0.function_info.internal.
       super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_1d0.function_info.internal.
            super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      in_RDI->global_initialization = local_1d0.global_initialization;
    }
    local_1d0.super_SimpleNamedParameterFunction.super_SimpleFunction.super_Function._vptr_Function
         = (_func_int **)&PTR__TableFunction_02435168;
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1d0.function_info.internal.
               super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
LAB_0116eb40:
  SimpleNamedParameterFunction::~SimpleNamedParameterFunction
            (&local_1d0.super_SimpleNamedParameterFunction);
  return in_RDI;
}

Assistant:

TableFunction ReadCSVTableFunction::GetFunction() {
	MultiFileFunction<CSVMultiFileInfo> read_csv("read_csv");
	read_csv.serialize = CSVReaderSerialize;
	read_csv.deserialize = CSVReaderDeserialize;
	read_csv.type_pushdown = MultiFileFunction<CSVMultiFileInfo>::PushdownType;
	ReadCSVAddNamedParameters(read_csv);
	return static_cast<TableFunction>(read_csv);
}